

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parseBaseUnresolvedName(Db *this)

{
  short *psVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  short *psVar5;
  
  psVar5 = (short *)this->First;
  psVar1 = (short *)this->Last;
  if ((psVar1 != psVar5) && ((int)(char)*psVar5 - 0x30U < 10)) {
    pNVar2 = parseSimpleId(this);
    return pNVar2;
  }
  if (((ulong)((long)psVar1 - (long)psVar5) < 2) || (*psVar5 != 0x6e64)) {
    psVar5 = (short *)this->First;
    if ((1 < (ulong)((long)psVar1 - (long)psVar5)) && (*psVar5 == 0x6e6f)) {
      this->First = (char *)(psVar5 + 1);
    }
    pNVar3 = parseOperatorName(this,(NameState *)0x0);
    pNVar2 = (Node *)0x0;
    if (((pNVar3 != (Node *)0x0) && (pNVar2 = pNVar3, this->Last != this->First)) &&
       (*this->First == 'I')) {
      pNVar4 = parseTemplateArgs(this,false);
      pNVar2 = (Node *)0x0;
      if (pNVar4 != (Node *)0x0) {
        pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar2->K = KNameWithTemplateArgs;
        pNVar2->RHSComponentCache = No;
        pNVar2->ArrayCache = No;
        pNVar2->FunctionCache = No;
        pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb680;
        pNVar2[1]._vptr_Node = (_func_int **)pNVar3;
        *(Node **)&pNVar2[1].K = pNVar4;
      }
    }
  }
  else {
    psVar5 = psVar5 + 1;
    this->First = (char *)psVar5;
    if ((psVar1 == psVar5) || (9 < (int)(char)*psVar5 - 0x30U)) {
      pNVar3 = parseUnresolvedType(this);
    }
    else {
      pNVar3 = parseSimpleId(this);
    }
    if (pNVar3 == (Node *)0x0) {
      pNVar2 = (Node *)0x0;
    }
    else {
      pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      pNVar2->K = KDtorName;
      pNVar2->RHSComponentCache = No;
      pNVar2->ArrayCache = No;
      pNVar2->FunctionCache = No;
      pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ead90;
      pNVar2[1]._vptr_Node = (_func_int **)pNVar3;
    }
  }
  return pNVar2;
}

Assistant:

Node *Db::parseBaseUnresolvedName() {
  if (std::isdigit(look()))
    return parseSimpleId();

  if (consumeIf("dn"))
    return parseDestructorName();

  consumeIf("on");

  Node *Oper = parseOperatorName(/*NameState=*/nullptr);
  if (Oper == nullptr)
    return nullptr;
  if (look() == 'I') {
    Node *TA = parseTemplateArgs();
    if (TA == nullptr)
      return nullptr;
    return make<NameWithTemplateArgs>(Oper, TA);
  }
  return Oper;
}